

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_Declarations.cpp
# Opt level: O2

bool __thiscall psy::C::Parser::parseArrayDesignator_AtFirst(Parser *this,DesignatorSyntax **desig)

{
  bool bVar1;
  SyntaxToken *pSVar2;
  ArrayDesignatorSyntax *pAVar3;
  IndexType IVar4;
  ostream *poVar5;
  
  pSVar2 = peek(this,1);
  if (pSVar2->syntaxK_ == OpenBracketToken) {
    pAVar3 = makeNode<psy::C::ArrayDesignatorSyntax>(this);
    *desig = &pAVar3->super_DesignatorSyntax;
    IVar4 = consume(this);
    pAVar3->openBracketTkIdx_ = IVar4;
    bVar1 = parseExpressionWithPrecedenceConditional(this,&pAVar3->expr_);
    if (bVar1) {
      bVar1 = matchOrSkipTo(this,CloseBracketToken,&pAVar3->closeBracketTkIdx_);
      return bVar1;
    }
  }
  else {
    poVar5 = std::operator<<((ostream *)&std::cout,"[ASSERT] at ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/parser/Parser_Declarations.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0x9fd);
    poVar5 = std::operator<<(poVar5," ");
    poVar5 = std::operator<<(poVar5,"assert failure: `[\'");
    std::endl<char,std::char_traits<char>>(poVar5);
  }
  return false;
}

Assistant:

bool Parser::parseArrayDesignator_AtFirst(DesignatorSyntax*& desig)
{
    DBG_THIS_RULE();
    PSY_ASSERT_3(peek().kind() == SyntaxKind::OpenBracketToken,
                  return false,
                  "assert failure: `['");

    auto arrDesig = makeNode<ArrayDesignatorSyntax>();
    desig = arrDesig;
    arrDesig->openBracketTkIdx_ = consume();

    return parseExpressionWithPrecedenceConditional(arrDesig->expr_)
                && matchOrSkipTo(SyntaxKind::CloseBracketToken, &arrDesig->closeBracketTkIdx_);
}